

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void ngai_get_first_last_indices(Integer g_a)

{
  int iVar1;
  logical lVar2;
  Integer IVar3;
  Integer node;
  Integer IVar4;
  ushort uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  C_Integer CVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  global_array_t *pgVar15;
  ushort uVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  Integer _d;
  long lStack_340;
  long local_328;
  long local_318;
  Integer id;
  long local_308;
  int local_300;
  int local_2fc;
  Integer _lo [7];
  Integer _hi [7];
  Integer index [7];
  Integer hi [7];
  Integer lo [7];
  Integer subscript [7];
  Integer map_offset [7];
  int _index [7];
  
  pgVar15 = GA;
  lVar12 = (long)GA[g_a + 1000].ndim;
  lVar6 = 0;
  lVar11 = 0;
  if (0 < lVar12) {
    lVar11 = lVar12;
  }
  local_328 = 1;
  for (; lVar11 != lVar6; lVar6 = lVar6 + 1) {
    local_328 = local_328 * GA[g_a + 1000].dims[lVar6];
  }
  lVar2 = pnga_is_mirrored(g_a);
  if (lVar2 == 0) {
    for (lVar6 = 0; lVar11 != lVar6; lVar6 = lVar6 + 1) {
      pgVar15[g_a + 1000].first[lVar6] = 0;
      pgVar15[g_a + 1000].last[lVar6] = -1;
      pgVar15[g_a + 1000].shm_length = -1;
    }
    return;
  }
  local_2fc = GA_Default_Proc_Group;
  GA_Default_Proc_Group = -1;
  IVar3 = pnga_cluster_nnodes();
  node = pnga_cluster_nodeid();
  IVar4 = pnga_cluster_nprocs(node);
  lVar6 = node * local_328;
  if (node != IVar3 + -1) {
    local_328 = (long)((double)((node + 1) * local_328) / (double)IVar3);
  }
  lVar6 = (long)((double)lVar6 / (double)IVar3);
  for (lVar7 = 0; lVar7 != lVar11; lVar7 = lVar7 + 1) {
    map_offset[lVar7] = 0;
    lVar8 = 0;
    for (lVar13 = 0; lVar7 != lVar13; lVar13 = lVar13 + 1) {
      lVar8 = lVar8 + GA[g_a + 1000].nblock[lVar13];
      map_offset[lVar7] = lVar8;
    }
  }
  lVar7 = 0;
  if (IVar4 < 1) {
    IVar4 = lVar7;
  }
  lVar8 = -1;
  local_308 = (g_a + 1000) * 0x368;
  lVar23 = 0;
  lVar13 = lVar8;
  for (; lVar7 != IVar4; lVar7 = lVar7 + 1) {
    pnga_proc_topology(g_a,lVar7,index);
    lVar9 = 1;
    for (lVar14 = 0; lVar11 != lVar14; lVar14 = lVar14 + 1) {
      lVar18 = index[lVar14];
      if (lVar18 < (long)GA[g_a + 1000].nblock[lVar14] + -1) {
        lVar21 = map_offset[lVar14] * 8 + *(long *)(GA->name + local_308 + -8);
        lVar18 = *(long *)(lVar21 + 8 + lVar18 * 8) - *(long *)(lVar21 + lVar18 * 8);
      }
      else {
        lVar18 = (GA[g_a + 1000].dims[lVar14] -
                 *(long *)(map_offset[lVar14] * 8 + *(long *)(GA->name + local_308 + -8) +
                          lVar18 * 8)) + 1;
      }
      lVar9 = lVar9 * lVar18;
    }
    lVar23 = lVar23 + lVar9;
    lVar9 = lVar8;
    if (lVar8 < 0) {
      lVar9 = lVar7;
    }
    if (lVar6 < lVar23) {
      lVar8 = lVar9;
    }
    lVar9 = lVar13;
    if (lVar13 < 0) {
      lVar9 = lVar7;
    }
    if (lVar8 < 0) {
      lVar9 = lVar13;
    }
    if (local_328 <= lVar23) {
      lVar13 = lVar9;
    }
  }
  lVar23 = 0;
  lVar7 = 0;
  if (0 < lVar8) {
    lVar7 = lVar8;
  }
  uVar22 = 0;
  for (; lVar23 != lVar7; lVar23 = lVar23 + 1) {
    pnga_distribution(g_a,lVar23,lo,hi);
    lVar9 = 1;
    for (lVar14 = 0; lVar11 != lVar14; lVar14 = lVar14 + 1) {
      lVar18 = ((hi[lVar14] - lo[lVar14]) + 1) * lVar9;
      lVar9 = 0;
      if (lo[lVar14] <= hi[lVar14]) {
        lVar9 = lVar18;
      }
    }
    uVar22 = uVar22 + lVar9;
  }
  pnga_distribution(g_a,lVar8,lo,hi);
  lVar23 = 0;
  lVar7 = 0;
  if (0 < lVar12 + -1) {
    lVar7 = lVar12 + -1;
  }
  lVar9 = 1;
  for (; lVar7 != lVar23; lVar23 = lVar23 + 1) {
    lVar9 = lVar9 * ((hi[lVar23] - lo[lVar23]) + 1);
  }
  lVar6 = lVar6 - uVar22;
  lVar9 = (lVar6 / lVar9 + 1) - (ulong)(lVar6 % lVar9 == 0);
  lVar6 = *(long *)((long)GA->dims + lVar12 * 8 + local_308 + -8);
  lVar23 = lVar6 + -1;
  if (lVar9 < lVar6) {
    lVar23 = lVar9;
  }
  pnga_proc_topology(g_a,lVar8,index);
  pgVar15 = GA;
  subscript[lVar12 + -1] = lVar23;
  for (lVar6 = 0; lVar7 != lVar6; lVar6 = lVar6 + 1) {
    subscript[lVar6] = 0;
  }
  for (lVar6 = 0; lVar11 != lVar6; lVar6 = lVar6 + 1) {
    *(Integer *)((long)pgVar15->first + lVar6 * 8 + local_308) =
         subscript[lVar6] +
         *(long *)(map_offset[lVar6] * 8 + *(long *)(pgVar15->name + local_308 + -8) +
                  index[lVar6] * 8);
  }
  if (lVar8 < lVar13) {
    lVar8 = 0;
    lVar6 = 0;
    if (0 < lVar13) {
      lVar6 = lVar13;
    }
    uVar22 = 0;
    for (; lVar8 != lVar6; lVar8 = lVar8 + 1) {
      pnga_distribution(g_a,lVar8,lo,hi);
      lVar23 = 1;
      for (lVar9 = 0; lVar11 != lVar9; lVar9 = lVar9 + 1) {
        lVar14 = ((hi[lVar9] - lo[lVar9]) + 1) * lVar23;
        lVar23 = 0;
        if (lo[lVar9] <= hi[lVar9]) {
          lVar23 = lVar14;
        }
      }
      uVar22 = uVar22 + lVar23;
    }
  }
  pnga_distribution(g_a,lVar13,lo,hi);
  lVar8 = local_308;
  lVar6 = 1;
  for (lVar23 = 0; lVar7 != lVar23; lVar23 = lVar23 + 1) {
    lVar6 = lVar6 * ((hi[lVar23] - lo[lVar23]) + 1);
  }
  subscript[lVar12 + -1] = (long)(local_328 + ~uVar22) / lVar6;
  for (lVar6 = 0; lVar7 != lVar6; lVar6 = lVar6 + 1) {
    subscript[lVar6] = hi[lVar6] - lo[lVar6];
  }
  pnga_proc_topology(g_a,lVar13,index);
  for (lVar6 = 0; lVar11 != lVar6; lVar6 = lVar6 + 1) {
    lVar12 = subscript[lVar6] +
             *(long *)(map_offset[lVar6] * 8 + *(long *)(GA->name + lVar8 + -8) + index[lVar6] * 8);
    if (GA[g_a + 1000].dims[lVar6] <= lVar12) {
      lVar12 = GA[g_a + 1000].dims[lVar6];
    }
    GA[g_a + 1000].last[lVar6] = lVar12;
  }
  iVar19 = *(int *)((long)GA->dims + lVar8 + -0x2c);
  switch(iVar19) {
  case 0x3e9:
  case 0x3eb:
    lStack_340 = 4;
    break;
  case 0x3ea:
  case 0x3ec:
  case 0x3ee:
  case 0x3f8:
    local_318 = 8;
    goto LAB_0017ed02;
  default:
    pnga_error("type not supported",(long)iVar19);
    local_318 = 0;
    goto LAB_0017ed02;
  case 0x3ef:
    lStack_340 = 0x10;
  }
  local_318 = lStack_340;
LAB_0017ed02:
  for (lVar6 = 0; lVar11 != lVar6; lVar6 = lVar6 + 1) {
    index[lVar6] = GA[g_a + 1000].first[lVar6];
  }
  pnga_locate(g_a,index,&id);
  lVar6 = id;
  uVar16 = *(ushort *)((long)GA->dims + lVar8 + -0x30);
  lVar12 = (long)(short)uVar16;
  iVar19 = *(int *)((long)GA->block_dims + lVar8 + -4);
  if (iVar19 - 1U < 3) {
    lVar13 = (long)(int)id % *(long *)((long)GA->num_blocks + lVar8);
    _index[0] = (int)lVar13;
    IVar4 = id;
    lVar7 = 0;
    while (lVar7 + 1 < lVar12) {
      IVar4 = (long)((int)IVar4 - (int)lVar13) / GA[g_a + 1000].num_blocks[lVar7];
      lVar13 = (long)(int)IVar4 % GA[g_a + 1000].num_blocks[lVar7 + 1];
      _index[lVar7 + 1] = (int)lVar13;
      lVar7 = lVar7 + 1;
    }
    lVar7 = 0;
    uVar5 = 0;
    if (0 < (short)uVar16) {
      uVar5 = uVar16;
    }
    for (; (ulong)uVar5 * 4 != lVar7; lVar7 = lVar7 + 4) {
      iVar19 = *(int *)((long)_index + lVar7);
      lVar13 = *(long *)((long)GA[g_a + 1000].block_dims + lVar7 * 2);
      *(long *)((long)_lo + lVar7 * 2) = lVar13 * iVar19 + 1;
      lVar13 = ((long)iVar19 + 1) * lVar13;
      lVar23 = *(long *)((long)GA[g_a + 1000].dims + lVar7 * 2);
      if (lVar23 <= lVar13) {
        lVar13 = lVar23;
      }
      *(long *)((long)_hi + lVar7 * 2) = lVar13;
    }
  }
  else if (iVar19 == 0) {
    lVar7 = *(long *)((long)GA->old_nblock + lVar8 + -0x30);
    if (lVar7 == 0) {
      lVar13 = 0;
      lVar7 = 0;
      if (0 < lVar12) {
        lVar7 = lVar12;
      }
      lVar23 = 1;
      for (; lVar7 != lVar13; lVar13 = lVar13 + 1) {
        lVar23 = lVar23 * GA[g_a + 1000].nblock[lVar13];
      }
      if (id < lVar23 && -1 < id) {
        lVar13 = 0;
        IVar4 = id;
        for (lVar23 = 0; lVar7 != lVar23; lVar23 = lVar23 + 1) {
          lVar9 = (long)GA[g_a + 1000].nblock[lVar23];
          lVar14 = (IVar4 % lVar9) * 8 + *(long *)(GA->name + lVar8 + -8);
          _lo[lVar23] = *(Integer *)(lVar14 + lVar13 * 8);
          if (IVar4 % lVar9 == lVar9 + -1) {
            CVar10 = GA[g_a + 1000].dims[lVar23];
          }
          else {
            CVar10 = *(long *)(lVar14 + 8 + lVar13 * 8) + -1;
          }
          lVar13 = lVar13 + lVar9;
          _hi[lVar23] = CVar10;
          IVar4 = IVar4 / lVar9;
        }
      }
      else {
        for (lVar13 = 0; lVar7 != lVar13; lVar13 = lVar13 + 1) {
          _lo[lVar13] = 0;
          _hi[lVar13] = -1;
        }
      }
    }
    else if (id < lVar7) {
      lVar13 = 0;
      lVar7 = 0;
      if (0 < lVar12) {
        lVar7 = lVar12;
      }
      lVar23 = 1;
      for (; lVar7 != lVar13; lVar13 = lVar13 + 1) {
        lVar23 = lVar23 * GA[g_a + 1000].nblock[lVar13];
      }
      if ((id < 0) || (lVar23 <= id)) {
        for (lVar13 = 0; lVar7 != lVar13; lVar13 = lVar13 + 1) {
          _lo[lVar13] = 0;
          _hi[lVar13] = -1;
        }
      }
      else {
        lVar23 = 0;
        IVar4 = id;
        for (lVar13 = 0; lVar7 != lVar13; lVar13 = lVar13 + 1) {
          lVar9 = (long)GA[g_a + 1000].nblock[lVar13];
          lVar14 = (IVar4 % lVar9) * 8 + *(long *)(GA->name + lVar8 + -8);
          _lo[lVar13] = *(Integer *)(lVar14 + lVar23 * 8);
          if (IVar4 % lVar9 == lVar9 + -1) {
            CVar10 = GA[g_a + 1000].dims[lVar13];
          }
          else {
            CVar10 = *(long *)(lVar14 + 8 + lVar23 * 8) + -1;
          }
          lVar23 = lVar23 + lVar9;
          _hi[lVar13] = CVar10;
          IVar4 = IVar4 / lVar9;
        }
      }
    }
    else {
      uVar22 = 0;
      uVar5 = 0;
      if (0 < (short)uVar16) {
        uVar5 = uVar16;
      }
      for (; uVar5 != uVar22; uVar22 = uVar22 + 1) {
        _lo[uVar22] = 0;
        _hi[uVar22] = -1;
      }
    }
  }
  else if (iVar19 == 4) {
    lVar13 = (long)(int)id % *(long *)((long)GA->num_blocks + lVar8);
    _index[0] = (int)lVar13;
    IVar4 = id;
    lVar7 = 0;
    while (lVar7 + 1 < lVar12) {
      IVar4 = (long)((int)IVar4 - (int)lVar13) / GA[g_a + 1000].num_blocks[lVar7];
      lVar13 = (long)(int)IVar4 % GA[g_a + 1000].num_blocks[lVar7 + 1];
      _index[lVar7 + 1] = (int)lVar13;
      lVar7 = lVar7 + 1;
    }
    lVar7 = 0;
    uVar5 = 0;
    if (0 < (short)uVar16) {
      uVar5 = uVar16;
    }
    iVar19 = 0;
    for (; (ulong)uVar5 * 4 != lVar7; lVar7 = lVar7 + 4) {
      lVar13 = *(long *)(GA->name + lVar8 + -8);
      iVar20 = *(int *)((long)_index + lVar7);
      lVar9 = (long)iVar19 + (long)iVar20;
      *(undefined8 *)((long)_lo + lVar7 * 2) = *(undefined8 *)(lVar13 + lVar9 * 8);
      lVar23 = *(long *)((long)GA->num_blocks + lVar7 * 2 + lVar8);
      if ((long)iVar20 < lVar23 + -1) {
        lVar13 = *(long *)(lVar13 + 8 + lVar9 * 8) + -1;
      }
      else {
        lVar13 = *(long *)((long)GA->dims + lVar7 * 2 + lVar8);
      }
      *(long *)((long)_hi + lVar7 * 2) = lVar13;
      iVar19 = iVar19 + (int)lVar23;
    }
  }
  local_300 = *(int *)((long)GA->block_dims + lVar8 + -0x18);
  pgVar15 = GA;
  for (lVar7 = 0; lVar8 = local_308, lVar7 < (short)uVar16; lVar7 = lVar7 + 1) {
    if ((pgVar15[g_a + 1000].first[lVar7] < _lo[lVar7]) ||
       (_hi[lVar7] < pgVar15[g_a + 1000].first[lVar7])) {
      sprintf((char *)_index,"check subscript failed:%ld not in (%ld:%ld) dim=%d");
      pnga_error((char *)_index,lVar7);
      uVar16 = *(ushort *)((long)GA->dims + local_308 + -0x30);
      pgVar15 = GA;
    }
  }
  lVar13 = 0;
  lVar7 = lVar12 + -1;
  if (lVar12 + -1 < 1) {
    lVar7 = lVar13;
  }
  lVar23 = 1;
  lVar9 = 0;
  for (; lVar7 != lVar13; lVar13 = lVar13 + 1) {
    lVar14 = *(long *)((long)pgVar15->width + lVar13 * 8 + local_308);
    lVar9 = lVar9 + ((lVar14 + *(long *)((long)pgVar15->first + lVar13 * 8 + local_308)) -
                    _lo[lVar13]) * lVar23;
    lVar23 = lVar23 * (((lVar14 * 2 + 1) - _lo[lVar13]) + _hi[lVar13]);
  }
  lVar7 = *(long *)((long)pgVar15->width + lVar12 * 8 + local_308 + 0x30);
  lVar13 = *(long *)(&local_300 + lVar12 * 2);
  lVar12 = *(long *)((long)pgVar15->width + lVar12 * 8 + local_308 + -8);
  if (local_300 == 0) {
    lVar6 = (long)PGRP_LIST->inv_map_proc_list[lVar6];
  }
  if (0 < *(long *)((long)pgVar15->old_nblock + local_308 + -0x30)) {
    lVar6 = *(long *)(*(long *)((long)pgVar15->old_nblock + local_308 + -0x38) + lVar6 * 8);
  }
  lVar6 = *(long *)(*(long *)(pgVar15->name + local_308 + -0x10) + lVar6 * 8);
  iVar19 = *(int *)((long)pgVar15->dims + local_308 + -0x18);
  for (lVar14 = 0; lVar11 != lVar14; lVar14 = lVar14 + 1) {
    index[lVar14] = pgVar15[g_a + 1000].last[lVar14];
  }
  pnga_locate(g_a,index,&id);
  uVar16 = *(ushort *)((long)GA->dims + lVar8 + -0x30);
  lVar11 = (long)(short)uVar16;
  iVar20 = *(int *)((long)GA->block_dims + lVar8 + -4);
  if (iVar20 - 1U < 3) {
    lVar18 = (long)(int)id % *(long *)((long)GA->num_blocks + lVar8);
    _index[0] = (int)lVar18;
    IVar4 = id;
    lVar14 = 0;
    while (lVar14 + 1 < lVar11) {
      IVar4 = (long)((int)IVar4 - (int)lVar18) / GA[g_a + 1000].num_blocks[lVar14];
      lVar18 = (long)(int)IVar4 % GA[g_a + 1000].num_blocks[lVar14 + 1];
      _index[lVar14 + 1] = (int)lVar18;
      lVar14 = lVar14 + 1;
    }
    lVar14 = 0;
    uVar5 = 0;
    if (0 < (short)uVar16) {
      uVar5 = uVar16;
    }
    for (; (ulong)uVar5 * 4 != lVar14; lVar14 = lVar14 + 4) {
      iVar20 = *(int *)((long)_index + lVar14);
      lVar18 = *(long *)((long)GA[g_a + 1000].block_dims + lVar14 * 2);
      *(long *)((long)_lo + lVar14 * 2) = lVar18 * iVar20 + 1;
      lVar18 = ((long)iVar20 + 1) * lVar18;
      lVar21 = *(long *)((long)GA[g_a + 1000].dims + lVar14 * 2);
      if (lVar21 <= lVar18) {
        lVar18 = lVar21;
      }
      *(long *)((long)_hi + lVar14 * 2) = lVar18;
    }
  }
  else if (iVar20 == 0) {
    lVar14 = *(long *)((long)GA->old_nblock + lVar8 + -0x30);
    if (lVar14 == 0) {
      lVar18 = 0;
      lVar14 = 0;
      if (0 < lVar11) {
        lVar14 = lVar11;
      }
      lVar21 = 1;
      for (; lVar14 != lVar18; lVar18 = lVar18 + 1) {
        lVar21 = lVar21 * GA[g_a + 1000].nblock[lVar18];
      }
      if (id < lVar21 && -1 < id) {
        lVar21 = 0;
        IVar4 = id;
        for (lVar18 = 0; lVar14 != lVar18; lVar18 = lVar18 + 1) {
          lVar17 = (long)GA[g_a + 1000].nblock[lVar18];
          lVar24 = (IVar4 % lVar17) * 8 + *(long *)(GA->name + lVar8 + -8);
          _lo[lVar18] = *(Integer *)(lVar24 + lVar21 * 8);
          if (IVar4 % lVar17 == lVar17 + -1) {
            CVar10 = GA[g_a + 1000].dims[lVar18];
          }
          else {
            CVar10 = *(long *)(lVar24 + 8 + lVar21 * 8) + -1;
          }
          lVar21 = lVar21 + lVar17;
          _hi[lVar18] = CVar10;
          IVar4 = IVar4 / lVar17;
        }
      }
      else {
        for (lVar18 = 0; lVar14 != lVar18; lVar18 = lVar18 + 1) {
          _lo[lVar18] = 0;
          _hi[lVar18] = -1;
        }
      }
    }
    else if (id < lVar14) {
      lVar18 = 0;
      lVar14 = 0;
      if (0 < lVar11) {
        lVar14 = lVar11;
      }
      lVar21 = 1;
      for (; lVar14 != lVar18; lVar18 = lVar18 + 1) {
        lVar21 = lVar21 * GA[g_a + 1000].nblock[lVar18];
      }
      if ((id < 0) || (lVar21 <= id)) {
        for (lVar18 = 0; lVar14 != lVar18; lVar18 = lVar18 + 1) {
          _lo[lVar18] = 0;
          _hi[lVar18] = -1;
        }
      }
      else {
        lVar21 = 0;
        IVar4 = id;
        for (lVar18 = 0; lVar14 != lVar18; lVar18 = lVar18 + 1) {
          lVar17 = (long)GA[g_a + 1000].nblock[lVar18];
          lVar24 = (IVar4 % lVar17) * 8 + *(long *)(GA->name + lVar8 + -8);
          _lo[lVar18] = *(Integer *)(lVar24 + lVar21 * 8);
          if (IVar4 % lVar17 == lVar17 + -1) {
            CVar10 = GA[g_a + 1000].dims[lVar18];
          }
          else {
            CVar10 = *(long *)(lVar24 + 8 + lVar21 * 8) + -1;
          }
          lVar21 = lVar21 + lVar17;
          _hi[lVar18] = CVar10;
          IVar4 = IVar4 / lVar17;
        }
      }
    }
    else {
      uVar22 = 0;
      uVar5 = 0;
      if (0 < (short)uVar16) {
        uVar5 = uVar16;
      }
      for (; uVar5 != uVar22; uVar22 = uVar22 + 1) {
        _lo[uVar22] = 0;
        _hi[uVar22] = -1;
      }
    }
  }
  else if (iVar20 == 4) {
    lVar18 = (long)(int)id % *(long *)((long)GA->num_blocks + lVar8);
    _index[0] = (int)lVar18;
    IVar4 = id;
    lVar14 = 0;
    while (lVar14 + 1 < lVar11) {
      IVar4 = (long)((int)IVar4 - (int)lVar18) / GA[g_a + 1000].num_blocks[lVar14];
      lVar18 = (long)(int)IVar4 % GA[g_a + 1000].num_blocks[lVar14 + 1];
      _index[lVar14 + 1] = (int)lVar18;
      lVar14 = lVar14 + 1;
    }
    lVar14 = 0;
    uVar5 = 0;
    if (0 < (short)uVar16) {
      uVar5 = uVar16;
    }
    iVar20 = 0;
    for (; (ulong)uVar5 * 4 != lVar14; lVar14 = lVar14 + 4) {
      lVar18 = *(long *)(GA->name + lVar8 + -8);
      iVar1 = *(int *)((long)_index + lVar14);
      lVar17 = (long)iVar20 + (long)iVar1;
      *(undefined8 *)((long)_lo + lVar14 * 2) = *(undefined8 *)(lVar18 + lVar17 * 8);
      lVar21 = *(long *)((long)GA->num_blocks + lVar14 * 2 + lVar8);
      if ((long)iVar1 < lVar21 + -1) {
        lVar18 = *(long *)(lVar18 + 8 + lVar17 * 8) + -1;
      }
      else {
        lVar18 = *(long *)((long)GA->dims + lVar14 * 2 + lVar8);
      }
      *(long *)((long)_hi + lVar14 * 2) = lVar18;
      iVar20 = iVar20 + (int)lVar21;
    }
  }
  iVar20 = *(int *)((long)GA->block_dims + lVar8 + -0x18);
  pgVar15 = GA;
  for (lVar14 = 0; lVar14 < (short)uVar16; lVar14 = lVar14 + 1) {
    if ((pgVar15[g_a + 1000].last[lVar14] < _lo[lVar14]) ||
       (_hi[lVar14] < pgVar15[g_a + 1000].last[lVar14])) {
      sprintf((char *)_index,"check subscript failed:%ld not in (%ld:%ld) dim=%d");
      pnga_error((char *)_index,lVar14);
      uVar16 = *(ushort *)((long)GA->dims + lVar8 + -0x30);
      pgVar15 = GA;
    }
  }
  lVar18 = 0;
  lVar14 = lVar11 + -1;
  if (lVar11 + -1 < 1) {
    lVar14 = lVar18;
  }
  lVar21 = 1;
  for (lVar17 = 0; lVar14 != lVar17; lVar17 = lVar17 + 1) {
    lVar24 = *(long *)((long)pgVar15->width + lVar17 * 8 + lVar8);
    lVar18 = lVar18 + ((lVar24 + *(long *)((long)pgVar15->last + lVar17 * 8 + lVar8)) - _lo[lVar17])
                      * lVar21;
    lVar21 = lVar21 * (((lVar24 * 2 + 1) - _lo[lVar17]) + _hi[lVar17]);
  }
  if (iVar20 == 0) {
    id = (Integer)PGRP_LIST->inv_map_proc_list[id];
  }
  if (0 < *(long *)((long)pgVar15->old_nblock + lVar8 + -0x30)) {
    id = *(long *)(*(long *)((long)pgVar15->old_nblock + lVar8 + -0x38) + id * 8);
  }
  *(long *)((long)pgVar15->lo + lVar8 + -8) =
       (local_318 - (lVar6 + (((lVar7 - lVar13) + lVar12) * lVar23 + lVar9) * (long)iVar19)) +
       (((*(long *)((long)pgVar15->first + lVar11 * 8 + lVar8 + 0x30) -
         *(long *)(&local_300 + lVar11 * 2)) +
        *(long *)((long)pgVar15->width + lVar11 * 8 + lVar8 + -8)) * lVar21 + lVar18) *
       (long)*(int *)((long)pgVar15->dims + lVar8 + -0x18) +
       *(long *)(*(long *)(pgVar15->name + lVar8 + -0x10) + id * 8);
  GA_Default_Proc_Group = local_2fc;
  return;
}

Assistant:

void ngai_get_first_last_indices( Integer g_a)  /* array handle (input) */
{

  Integer  lo[MAXDIM], hi[MAXDIM];
  Integer  nelems, nnodes, inode, nproc;
  Integer  ifirst, ilast, nfirst, nlast, icnt, np;
  Integer  i, j, itmp, ndim, map_offset[MAXDIM];
  /* Integer  icheck; */
  Integer  index[MAXDIM], subscript[MAXDIM];
  Integer  handle = GA_OFFSET + g_a;
  Integer  type, size=0, id;
  /* Integer  grp_id; */
  int Save_default_group;
  char     *fptr, *lptr;

  /* find total number of elements */
  ndim = GA[handle].ndim;
  nelems = 1;
  for (i=0; i<ndim; i++) nelems *= GA[handle].dims[i];

  /* If array is mirrored, evaluate first and last indices */
  if (pnga_is_mirrored(g_a)) {
    /* If default group is not world group, change default group to world group
       temporarily */
    Save_default_group = GA_Default_Proc_Group;
    GA_Default_Proc_Group = -1;
    nnodes = pnga_cluster_nnodes();
    inode = pnga_cluster_nodeid();
    nproc = pnga_cluster_nprocs(inode);
    /* grp_id = GA[handle].p_handle; */
    ifirst = (Integer)((double)(inode*nelems)/((double)nnodes));
    if (inode != nnodes-1) {
      ilast = (Integer)((double)((inode+1)*nelems)/((double)nnodes))-1;
    } else {
      ilast = nelems-1;
    }
    /* ifirst and ilast correspond to offsets in shared memory. Find the
       actual indices of the data elements corresponding to these offsets.
       The map_offset array provides a convenient mechanism for extracting
       the first indices on each processor along each coordinate dimension
       from the mapc array. */
    for (i = 0; i<ndim; i++) {
      map_offset[i] = 0;
      for (j = 0; j<i; j++) {
        map_offset[i] += GA[handle].nblock[j];
      }
    }
    icnt = 0;
    nfirst = -1;
    nlast = -1;
    for (i = 0; i<nproc; i++) {
      /* find block indices corresponding to proc i */
      pnga_proc_topology(g_a, i, index);
      nelems = 1;
      for (j = 0; j<ndim; j++) {
        if (index[j] < GA[handle].nblock[j]-1) {
          
          itmp = ((Integer)GA[handle].mapc[map_offset[j]+index[j]+1]
               - (Integer)GA[handle].mapc[map_offset[j]+index[j]]);
          nelems *= itmp;
        } else {
          itmp = ((Integer)GA[handle].dims[j]
               - (Integer)GA[handle].mapc[map_offset[j]+index[j]] + 1);
          nelems *= itmp;
        }
      }
      icnt += nelems;
      if (icnt-1 >= ifirst && nfirst < 0) {
        nfirst = i;
      }
      if (ilast <= icnt-1 && nfirst >= 0 && nlast < 0) {
        nlast = i;
      }
    }
    /* Adjust indices corresponding to start and end of block of
       shared memory so that it can be decomposed into large
       rectangular blocks of the global array. Start by
       adusting the lower index */
    icnt = 0;
    for (i = 0; i<nfirst; i++) {
      pnga_distribution(g_a, i, lo, hi);
      nelems = 1;
      for (j = 0; j<ndim; j++) {
        if (hi[j] >= lo[j]) {
          nelems *= (hi[j] - lo[j] + 1);
        } else {
          nelems = 0;
        }
      }
      icnt += nelems;
    }
    /* calculate offset in local block of memory */
    ifirst = ifirst - icnt;
    /* find dimensions of data on block nfirst */
    np = nfirst;
    pnga_distribution(g_a, np, lo, hi);
    nelems = 1;
    for (i=0; i<ndim-1; i++) {
      nelems *= (hi[i] - lo[i] + 1);
    }
    if (ifirst%nelems == 0) {
      ifirst = ifirst/nelems;
    } else {
      ifirst = (ifirst-ifirst%nelems)/nelems;
      ifirst++;
    }
    if (ifirst > GA[handle].dims[ndim-1]-1) ifirst=GA[handle].dims[ndim-1]-1;
    /* adjust value of ifirst */
    pnga_proc_topology(g_a, nfirst, index);
    subscript[ndim-1] = ifirst;
    for (i=0; i<ndim-1; i++) {
      subscript[i] = 0;
    }
    /* Finally, evaluate absolute indices of first data point */
    for (i=0; i<ndim; i++) {
      GA[handle].first[i] = GA[handle].mapc[map_offset[i]+index[i]]
                          + (C_Integer)subscript[i];
    }
    /* adjust upper bound. If nlast = nfirst, just use old value of icnt */
    if (nlast > nfirst) {
      icnt = 0;
      for (i = 0; i<nlast; i++) {
        pnga_distribution(g_a, i, lo, hi);
        nelems = 1;
        for (j = 0; j<ndim; j++) {
          if (hi[j] >= lo[j]) {
            nelems *= (hi[j] - lo[j] + 1);
          } else {
            nelems = 0;
          }
        }
        icnt += nelems;
      }
    }
    ilast = ilast - icnt;
    /* find dimensions of data on block nlast */
    np = nlast;
    pnga_distribution(g_a, np, lo, hi);
    nelems = 1;
    for (i=0; i<ndim-1; i++) {
      nelems *= (hi[i] - lo[i] + 1);
    }
    ilast = (ilast-ilast%nelems)/nelems;
    /* adjust value of ilast */
    subscript[ndim-1] = ilast;
    for (i=0; i<ndim-1; i++) {
      subscript[i] = (hi[i] - lo[i]);
    }
    pnga_proc_topology(g_a, nlast, index);
    /*
    icheck = 1;
    for (i=1; i<ndim; i++) {
      if (index[i] < GA[handle].nblock[i]-1) {
        itmp = (Integer)GA[handle].mapc[map_offset[i]+index[i]+1]
             - (Integer)GA[handle].mapc[map_offset[i]+index[i]];
      } else {
        itmp = (Integer)GA[handle].dims[i]
             - (Integer)GA[handle].mapc[map_offset[i]+index[i]] + 1;
      }
      if (subscript[i] < itmp-1) icheck = 0;
      subscript[i] = itmp-1;
    }
    if (!icheck) {
      subscript[0]--;
    } */
    /* Finally, evaluate absolute indices of last data point */
    for (i=0; i<ndim; i++) {
      GA[handle].last[i] = GA[handle].mapc[map_offset[i]+index[i]]
                          + (C_Integer)subscript[i];
      if (GA[handle].last[i] > GA[handle].dims[i]) {
        GA[handle].last[i] = GA[handle].dims[i];
      }
    }
    /* find length of shared memory segment owned by this node. Adjust
     * length, if necessary, to account for gaps in memory between
     * processors */
    type = GA[handle].type;
    switch(type) {
      case C_FLOAT: size = sizeof(float); break;
      case C_DBL: size = sizeof(double); break;
      case C_LONG: size = sizeof(long); break;
      case C_LONGLONG: size = sizeof(long long); break;
      case C_INT: size = sizeof(int); break;
      case C_SCPL: size = 2*sizeof(float); break;
      case C_DCPL: size = 2*sizeof(double); break;
      default: pnga_error("type not supported",type);
    }
    for (i=0; i<ndim; i++) index[i] = (Integer)GA[handle].first[i];
    i = (int)pnga_locate(g_a, index, &id);
    gam_Loc_ptr(id, handle, (Integer)GA[handle].first, &fptr);

    for (i=0; i<ndim; i++) index[i] = (Integer)GA[handle].last[i];
    i = (int)pnga_locate(g_a, index, &id);
    gam_Loc_ptr(id, handle, (Integer)GA[handle].last, &lptr);

    GA[handle].shm_length = (C_Long)(lptr - fptr + size);
    GA_Default_Proc_Group = Save_default_group;
  } else {
    for (i=0; i<ndim; i++) {
      GA[handle].first[i] = 0;
      GA[handle].last[i] = -1;
      GA[handle].shm_length = -1;
    }
  }
}